

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool replaceAt)

{
  t_domain tVar1;
  cmState *this_00;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  _Alloc_hider __s;
  string *psVar9;
  ostream *poVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte bVar13;
  byte *local_2b8;
  MessageType local_298;
  allocator<char> local_291;
  string varresult;
  string result;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  long local_230;
  string svalue;
  char *next;
  string varresult_1;
  string variable;
  
  pbVar12 = (byte *)(source->_M_dataplus)._M_p;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&result);
  openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = this->GlobalGenerator->CMakeInstance->State;
  if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
       ::lineVar_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                   ::lineVar_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE",(allocator<char> *)&variable);
    __cxa_atexit(std::__cxx11::string::~string,
                 &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                  ::lineVar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                         ::lineVar_abi_cxx11_);
  }
  local_230 = line;
  bVar13 = *pbVar12;
  local_298 = LOG;
  bVar3 = false;
  local_2b8 = pbVar12;
  do {
    if (bVar13 == 10) {
      local_230 = local_230 + 1;
    }
    else if (bVar13 == 0x24) {
      if (atOnly) {
LAB_0016ed8d:
        if (!noEscapes) {
          bVar13 = pbVar12[1];
          if (bVar13 == 0x3b) {
            if (openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
                super__Vector_impl_data._M_start !=
                openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_0016ef71:
              iVar6 = isalnum((int)(char)bVar13);
              if ((bVar13 == 0) || (iVar6 != 0)) {
                std::__cxx11::string::append((char *)errorstr);
                if (bVar13 != 0) {
                  std::__cxx11::string::push_back((char)errorstr);
                }
                bVar3 = true;
                std::__cxx11::string::append((char *)errorstr);
              }
              else {
                std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
                local_2b8 = pbVar12 + 1;
              }
            }
          }
          else {
            if (bVar13 == 0x6e) {
              std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
              std::__cxx11::string::append((char *)&result);
            }
            else if (bVar13 == 0x72) {
              std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
              std::__cxx11::string::append((char *)&result);
            }
            else {
              if (bVar13 != 0x74) goto LAB_0016ef71;
              std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
              std::__cxx11::string::append((char *)&result);
            }
            local_2b8 = pbVar12 + 2;
          }
          if (*local_2b8 != 0) {
            pbVar12 = pbVar12 + 1;
          }
        }
      }
      else {
        uVar2 = (ulong)svalue._M_dataplus._M_p >> 0x20;
        svalue._M_dataplus._M_p = (pointer)(uVar2 << 0x20);
        svalue._M_string_length = 0;
        next = (char *)(pbVar12 + 1);
        bVar13 = pbVar12[1];
        if (bVar13 == 0) {
          std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
          local_2b8 = (byte *)next;
        }
        else if (bVar13 != 0x3c) {
          if (bVar13 == 0x7b) {
            pbVar11 = pbVar12 + 2;
            svalue._M_dataplus._M_p = (pointer)(uVar2 << 0x20);
          }
          else {
            bVar4 = cmHasLiteralPrefix<char_const*,5ul>(&next,(char (*) [5])"ENV{");
            if (bVar4) {
              pbVar11 = pbVar12 + 5;
              svalue._M_dataplus._M_p._0_4_ = 1;
            }
            else {
              bVar4 = cmHasLiteralPrefix<char_const*,7ul>(&next,(char (*) [7])"CACHE{");
              if (!bVar4) {
                bVar4 = cmsys::RegularExpression::find(&this->cmNamedCurly,next);
                if (bVar4) {
                  varresult_1._M_dataplus._M_p = (pointer)&varresult_1.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&varresult_1,next,
                             next + ((long)(this->cmNamedCurly).regmatch.endp[0] -
                                    (long)(this->cmNamedCurly).regmatch.searchstring));
                  std::operator+(&varresult,"Syntax $",&varresult_1);
                  std::operator+(&variable,&varresult,
                                 "{} is not supported.  Only ${}, $ENV{}, and $CACHE{} are allowed."
                                );
                  std::__cxx11::string::operator=((string *)errorstr,(string *)&variable);
                  std::__cxx11::string::~string((string *)&variable);
                  std::__cxx11::string::~string((string *)&varresult);
                  std::__cxx11::string::~string((string *)&varresult_1);
                  bVar3 = true;
                  local_298 = FATAL_ERROR;
                }
                goto LAB_0016f11b;
              }
              pbVar11 = pbVar12 + 7;
              svalue._M_dataplus._M_p._0_4_ = 2;
            }
          }
          std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
          svalue._M_string_length = result._M_string_length;
          std::vector<t_lookup,_std::allocator<t_lookup>_>::push_back
                    (&openstack,(value_type *)&svalue);
          pbVar12 = pbVar11 + -1;
          local_2b8 = pbVar11;
        }
      }
    }
    else if (bVar13 == 0x40) {
      if (replaceAt) {
        pbVar11 = pbVar12 + 1;
        pbVar7 = (byte *)strchr((char *)pbVar11,0x40);
        if ((pbVar7 != pbVar11 && pbVar7 != (byte *)0x0) &&
           (sVar8 = strspn((char *)pbVar11,
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
           pbVar7 == pbVar11 + sVar8)) {
          variable._M_dataplus._M_p = (pointer)&variable.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&variable,pbVar11,pbVar11 + ~(ulong)pbVar12 + (long)pbVar7);
          varresult._M_string_length = 0;
          varresult._M_dataplus._M_p = (pointer)&varresult.field_2;
          varresult.field_2._M_local_buf[0] = '\0';
          if ((filename == (char *)0x0) ||
             (_Var5 = std::operator==(&variable,
                                      &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                       ::lineVar_abi_cxx11_), !_Var5)) {
            psVar9 = GetDef(this,&variable);
            if (psVar9 == (string *)0x0) {
              if (this->SuppressSideEffects == false) {
                MaybeWarnUninitialized(this,&variable,filename);
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&varresult);
            }
          }
          else {
            std::__cxx11::to_string(&varresult_1,local_230);
            std::__cxx11::string::operator=((string *)&varresult,(string *)&varresult_1);
            std::__cxx11::string::~string((string *)&varresult_1);
          }
          if (escapeQuotes) {
            cmSystemTools::EscapeQuotes(&varresult_1,&varresult);
            std::__cxx11::string::operator=((string *)&varresult,(string *)&varresult_1);
            std::__cxx11::string::~string((string *)&varresult_1);
          }
          std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
          std::__cxx11::string::append((string *)&result);
          local_2b8 = pbVar7 + 1;
          std::__cxx11::string::~string((string *)&varresult);
          std::__cxx11::string::~string((string *)&variable);
          pbVar12 = pbVar7;
          goto LAB_0016f11b;
        }
      }
LAB_0016ec61:
      if (((openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
            super__Vector_impl_data._M_start !=
            openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
            super__Vector_impl_data._M_finish) && (iVar6 = isalnum((int)(char)bVar13), iVar6 == 0))
         && ((0x34 < bVar13 - 0x2b ||
             ((0x1000000000001dU >> ((ulong)(bVar13 - 0x2b) & 0x3f) & 1) == 0)))) {
        std::__cxx11::string::append((char *)errorstr);
        std::__cxx11::string::push_back((char)errorstr);
        std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
        std::__cxx11::string::substr((ulong)&varresult_1,(ulong)&result);
        std::operator+(&varresult,"\') in a variable name: \'",&varresult_1);
        std::operator+(&variable,&varresult,"\'");
        std::__cxx11::string::append((string *)errorstr);
        std::__cxx11::string::~string((string *)&variable);
        std::__cxx11::string::~string((string *)&varresult);
        std::__cxx11::string::~string((string *)&varresult_1);
        goto LAB_0016f3cf;
      }
    }
    else {
      if (bVar13 == 0x5c) goto LAB_0016ed8d;
      if (bVar13 != 0x7d) {
        if (bVar13 != 0) goto LAB_0016ec61;
        if (bVar3) goto LAB_0016f3cf;
        break;
      }
      if (openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
          super__Vector_impl_data._M_start ==
          openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0016f11b;
      tVar1 = openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].domain;
      uVar2 = openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].loc;
      openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
      super__Vector_impl_data._M_finish =
           openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      std::__cxx11::string::append((char *)&result,(ulong)local_2b8);
      std::__cxx11::string::substr((ulong)&varresult,(ulong)&result);
      varresult_1._M_dataplus._M_p = (pointer)&varresult_1.field_2;
      varresult_1._M_string_length = 0;
      svalue._M_dataplus._M_p = (pointer)&svalue.field_2;
      svalue._M_string_length = 0;
      varresult_1.field_2._M_local_buf[0] = '\0';
      svalue.field_2._M_local_buf[0] = '\0';
      if (tVar1 == NORMAL) {
        if ((filename == (char *)0x0) ||
           (_Var5 = std::operator==(&varresult,
                                    &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                     ::lineVar_abi_cxx11_), !_Var5)) {
          __s._M_p = GetDefinition(this,&varresult);
          goto LAB_0016f050;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable);
        std::ostream::_M_insert<long>((long)&variable);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&varresult_1,(string *)&next);
        std::__cxx11::string::~string((string *)&next);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable);
LAB_0016f0a4:
        if (this->SuppressSideEffects == false) {
          MaybeWarnUninitialized(this,&varresult,filename);
        }
      }
      else {
        if (tVar1 == ENVIRONMENT) {
          bVar4 = cmsys::SystemTools::GetEnv(&varresult,&svalue);
          __s._M_p = svalue._M_dataplus._M_p;
          if (bVar4) goto LAB_0016f050;
          goto LAB_0016f0a4;
        }
        if (tVar1 != CACHE) goto LAB_0016f0a4;
        __s._M_p = cmState::GetCacheEntryValue(this_00,&varresult);
LAB_0016f050:
        if (__s._M_p == (char *)0x0) goto LAB_0016f0a4;
        if (escapeQuotes) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&next,__s._M_p,&local_291);
          cmSystemTools::EscapeQuotes(&variable,(string *)&next);
          std::__cxx11::string::operator=((string *)&varresult_1,(string *)&variable);
          std::__cxx11::string::~string((string *)&variable);
          std::__cxx11::string::~string((string *)&next);
        }
        else {
          std::__cxx11::string::assign((char *)&varresult_1);
        }
      }
      std::__cxx11::string::replace
                ((ulong)&result,uVar2,(string *)(result._M_string_length - uVar2));
      local_2b8 = pbVar12 + 1;
      std::__cxx11::string::~string((string *)&svalue);
      std::__cxx11::string::~string((string *)&varresult_1);
      std::__cxx11::string::~string((string *)&varresult);
    }
LAB_0016f11b:
    if (bVar3) goto LAB_0016f3cf;
    bVar13 = pbVar12[1];
    pbVar12 = pbVar12 + 1;
  } while (bVar13 != 0);
  if (openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
      super__Vector_impl_data._M_start ==
      openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)&result);
    std::__cxx11::string::_M_assign((string *)source);
  }
  else {
    std::__cxx11::string::append((char *)errorstr);
LAB_0016f3cf:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable);
    std::operator<<((ostream *)&variable,"Syntax error in cmake code ");
    if (filename != (char *)0x0) {
      poVar10 = std::operator<<((ostream *)&variable,"at\n");
      poVar10 = std::operator<<(poVar10,"  ");
      poVar10 = std::operator<<(poVar10,filename);
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = std::ostream::_M_insert<long>((long)poVar10);
      std::operator<<(poVar10,"\n");
    }
    poVar10 = std::operator<<((ostream *)&variable,"when parsing string\n");
    poVar10 = std::operator<<(poVar10,"  ");
    poVar10 = std::operator<<(poVar10,(string *)source);
    std::operator<<(poVar10,"\n");
    std::operator<<((ostream *)&variable,(string *)errorstr);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)errorstr,(string *)&varresult);
    std::__cxx11::string::~string((string *)&varresult);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable);
    local_298 = FATAL_ERROR;
  }
  std::_Vector_base<t_lookup,_std::allocator<t_lookup>_>::~_Vector_base
            (&openstack.super__Vector_base<t_lookup,_std::allocator<t_lookup>_>);
  std::__cxx11::string::~string((string *)&result);
  return local_298;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  MessageType mtype = MessageType::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = nullptr;
          std::string varresult;
          std::string svalue;
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = svalue.c_str();
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(value);
            } else {
              varresult = value;
            }
          } else if (!this->SuppressSideEffects) {
            this->MaybeWarnUninitialized(lookup, filename);
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = nullptr;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = MessageType::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 +
                  strspn(in + 1,
                         "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);

            std::string varresult;
            if (filename && variable == lineVar) {
              varresult = std::to_string(line);
            } else {
              const std::string* def = this->GetDef(variable);
              if (def) {
                varresult = *def;
              } else if (!this->SuppressSideEffects) {
                this->MaybeWarnUninitialized(variable, filename);
              }
            }

            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
      // Failed to find a valid @ expansion; treat it as literal.
      /* FALLTHROUGH */
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = MessageType::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = MessageType::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}